

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O1

void __thiscall ValueMapSymbol::restoreXml(ValueMapSymbol *this,Element *el,SleighBase *trans)

{
  uint *puVar1;
  Element *this_00;
  iterator __position;
  PatternExpression *pPVar2;
  string *psVar3;
  pointer ppEVar4;
  intb val;
  istringstream s;
  string local_1d0;
  long local_1b0 [3];
  uint auStack_198 [24];
  ios_base local_138 [264];
  
  ppEVar4 = (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar2 = PatternExpression::restoreExpression(*ppEVar4,&trans->super_Translate);
  (this->super_ValueSymbol).patval = (PatternValue *)pPVar2;
  pPVar2->refcount = pPVar2->refcount + 1;
  ppEVar4 = ppEVar4 + 1;
  if (ppEVar4 !=
      (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppEVar4;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"val","");
      psVar3 = Element::getAttributeValue(this_00,&local_1d0);
      std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)psVar3,_S_in);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      puVar1 = (uint *)((long)auStack_198 + *(long *)(local_1b0[0] + -0x18));
      *puVar1 = *puVar1 & 0xffffffb5;
      std::istream::_M_extract<long>(local_1b0);
      __position._M_current =
           (this->valuetable).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->valuetable).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&this->valuetable,__position,
                   (long *)&local_1d0);
      }
      else {
        *__position._M_current = (long)local_1d0._M_dataplus._M_p;
        (this->valuetable).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base(local_138);
      ppEVar4 = ppEVar4 + 1;
    } while (ppEVar4 !=
             (el->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  checkTableFill(this);
  return;
}

Assistant:

void ValueMapSymbol::restoreXml(const Element *el,SleighBase *trans)

{
  const List &list(el->getChildren());
  List::const_iterator iter;
  iter = list.begin();
  patval = (PatternValue *) PatternExpression::restoreExpression(*iter,trans);
  patval->layClaim();
  ++iter;
  while(iter != list.end()) {
    istringstream s((*iter)->getAttributeValue("val"));
    s.unsetf(ios::dec | ios::hex | ios::oct);
    intb val;
    s >> val;
    valuetable.push_back(val);
    ++iter;
  }
  checkTableFill();
}